

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

int lj_cparse_case(GCstr *str,char *match)

{
  uint uVar1;
  int iVar2;
  int local_28;
  int n;
  MSize len;
  char *match_local;
  GCstr *str_local;
  
  local_28 = 0;
  _n = match;
  while( true ) {
    uVar1 = (uint)*_n;
    if (uVar1 == 0) {
      return -1;
    }
    if ((str->len == uVar1) && (iVar2 = memcmp(_n + 1,str + 1,(ulong)uVar1), iVar2 == 0)) break;
    local_28 = local_28 + 1;
    _n = _n + 1 + uVar1;
  }
  return local_28;
}

Assistant:

int lj_cparse_case(GCstr *str, const char *match)
{
  MSize len;
  int n;
  for  (n = 0; (len = (MSize)*match++); n++, match += len) {
    if (str->len == len && !memcmp(match, strdata(str), len))
      return n;
  }
  return -1;
}